

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

istream * __thiscall nivalis::Plotter::import_json(Plotter *this,istream *is,string *error_msg)

{
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init;
  initializer_list_t init_00;
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  size_type sVar4;
  reference pvVar5;
  ostream *poVar6;
  reference pvVar7;
  unsigned_long *puVar8;
  reference pvVar9;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_00;
  size_type sVar10;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *pbVar11;
  long in_RDX;
  istream *in_RSI;
  Plotter *in_RDI;
  double dVar12;
  parse_error *e;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  bool imp_use_latex;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *jcol_1;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  int cf;
  json *jint;
  int id;
  value_type *jcol;
  value_type *f;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *jfunc;
  iterator __end3_2;
  iterator __begin3_2;
  value_type *__range3_2;
  size_t idx_1;
  size_t idx;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *slider;
  iterator __end3_1;
  iterator __begin3_1;
  value_type *__range3_1;
  int old_shigh;
  int old_swid;
  json *jview;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *line;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  Shell tmpshell;
  ostringstream ss;
  string *in_stack_00000b08;
  json j;
  Environment *in_stack_fffffffffffff278;
  Environment *in_stack_fffffffffffff280;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_01;
  Environment *in_stack_fffffffffffff288;
  ulong uVar13;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffff290;
  size_t in_stack_fffffffffffff298;
  undefined7 in_stack_fffffffffffff2a0;
  undefined1 in_stack_fffffffffffff2a7;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffff2a8;
  allocator<char> *in_stack_fffffffffffff2b0;
  string *in_stack_fffffffffffff2b8;
  string *hex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2c0;
  int in_stack_fffffffffffff2cc;
  undefined8 in_stack_fffffffffffff2e8;
  undefined1 mode_explicit;
  string *in_stack_fffffffffffff2f0;
  Environment *in_stack_fffffffffffff2f8;
  undefined4 in_stack_fffffffffffff30c;
  undefined2 uVar14;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffff310;
  iterator in_stack_fffffffffffff318;
  Plotter *in_stack_fffffffffffff320;
  string *in_stack_fffffffffffff338;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffff340;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffff388;
  undefined4 in_stack_fffffffffffff390;
  undefined4 in_stack_fffffffffffff394;
  undefined7 in_stack_fffffffffffff488;
  undefined1 in_stack_fffffffffffff48f;
  Plotter *in_stack_fffffffffffff490;
  undefined8 **local_970;
  undefined8 **local_958;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_938;
  ulong local_930;
  string local_928 [32];
  ulong local_908;
  string local_900 [32];
  ulong local_8e0;
  byte local_8d1;
  string local_8d0 [64];
  string *in_stack_fffffffffffff770;
  Shell *in_stack_fffffffffffff778;
  string local_810 [32];
  string local_7f0 [152];
  size_t in_stack_fffffffffffff8a8;
  Plotter *in_stack_fffffffffffff8b0;
  string local_710 [32];
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  unsigned_long local_630;
  int local_624;
  string local_530 [72];
  string *in_stack_fffffffffffffb18;
  string local_4d8 [32];
  reference local_4b8;
  reference local_4b0;
  reference local_458;
  size_type local_450;
  string local_448 [32];
  size_type local_428;
  reference local_420;
  Plotter *local_3c8;
  int local_3c0;
  int local_3bc;
  reference local_3b8;
  string local_3b0 [32];
  string local_390 [32];
  reference local_370;
  reference local_318;
  ostringstream local_2f8 [383];
  allocator<char> local_179;
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  undefined1 local_d9;
  undefined1 **local_d8;
  undefined8 *local_d0 [4];
  undefined1 local_b0 [32];
  undefined1 **local_90;
  undefined8 local_88;
  undefined1 **local_80;
  undefined8 *local_78 [4];
  undefined1 **local_58;
  undefined8 local_50;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  istream *local_10;
  
  uVar14 = (undefined2)((uint)in_stack_fffffffffffff30c >> 0x10);
  local_10 = in_RSI;
  if (in_RDX != 0) {
    std::__cxx11::string::clear();
  }
  std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::clear
            ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)0x146818);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffff280,in_stack_fffffffffffff278);
  nlohmann::operator>>
            ((istream *)CONCAT44(in_stack_fffffffffffff394,in_stack_fffffffffffff390),
             in_stack_fffffffffffff388);
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::is_array(&local_28);
  mode_explicit = (undefined1)((ulong)in_stack_fffffffffffff2e8 >> 0x38);
  if (bVar1) {
    local_d9 = 1;
    local_80 = (undefined1 **)local_78;
    local_d8 = (undefined1 **)local_d0;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::json_ref<const_char_(&)[6],_0>
              ((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)in_stack_fffffffffffff280,(char (*) [6])in_stack_fffffffffffff278);
    local_d8 = (undefined1 **)local_b0;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&,_0>
              ((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)in_stack_fffffffffffff280,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffff278);
    local_90 = (undefined1 **)local_d0;
    local_88 = 2;
    init._M_len._0_7_ = in_stack_fffffffffffff2a0;
    init._M_array = (iterator)in_stack_fffffffffffff298;
    init._M_len._7_1_ = in_stack_fffffffffffff2a7;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::json_ref(in_stack_fffffffffffff290,init);
    local_d9 = 0;
    local_58 = (undefined1 **)local_78;
    local_50 = 1;
    init_00._M_len = (size_type)in_stack_fffffffffffff320;
    init_00._M_array = in_stack_fffffffffffff318;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(in_stack_fffffffffffff310,init_00,SUB21((ushort)uVar14 >> 8,0),(value_t)uVar14);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(&in_stack_fffffffffffff290->owned_value,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)in_stack_fffffffffffff288);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_stack_fffffffffffff280);
    local_958 = &local_58;
    do {
      local_958 = local_958 + -4;
      nlohmann::detail::
      json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)0x146993);
    } while (local_958 != local_78);
    local_970 = &local_90;
    do {
      local_970 = local_970 + -4;
      nlohmann::detail::
      json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)0x1469e5);
      mode_explicit = (undefined1)((ulong)in_stack_fffffffffffff2e8 >> 0x38);
    } while (local_970 != local_d0);
  }
  Environment::clear(in_stack_fffffffffffff280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2c0,(char *)in_stack_fffffffffffff2b8,in_stack_fffffffffffff2b0);
  uVar3 = Environment::addr_of
                    (in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0,(bool)mode_explicit);
  in_RDI->x_var = (uint32_t)uVar3;
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2c0,(char *)in_stack_fffffffffffff2b8,in_stack_fffffffffffff2b0);
  uVar3 = Environment::addr_of
                    (in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0,(bool)mode_explicit);
  in_RDI->y_var = (uint32_t)uVar3;
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2c0,(char *)in_stack_fffffffffffff2b8,in_stack_fffffffffffff2b0);
  uVar3 = Environment::addr_of
                    (in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0,(bool)mode_explicit);
  in_RDI->t_var = (uint32_t)uVar3;
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2c0,(char *)in_stack_fffffffffffff2b8,in_stack_fffffffffffff2b0);
  uVar3 = Environment::addr_of
                    (in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0,(bool)mode_explicit);
  in_RDI->r_var = (uint32_t)uVar3;
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  std::__cxx11::ostringstream::ostringstream(local_2f8);
  Shell::Shell((Shell *)in_stack_fffffffffffff280,in_stack_fffffffffffff278,(ostream *)0x146e75);
  sVar4 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::count<char_const(&)[6]>
                    (&in_stack_fffffffffffff290->owned_value,(char (*) [6])in_stack_fffffffffffff288
                    );
  if (sVar4 != 0) {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::is_array(pvVar5);
    if (bVar1) {
      local_318 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            (in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)in_stack_fffffffffffff288);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)in_stack_fffffffffffff288);
      while (bVar1 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)in_stack_fffffffffffff280,
                                  (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)in_stack_fffffffffffff278), bVar1) {
        local_370 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)in_stack_fffffffffffff2f8);
        bVar1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::is_string(local_370);
        if (bVar1) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (in_stack_fffffffffffff2a8);
          bVar1 = Shell::eval_line(in_stack_fffffffffffff778,in_stack_fffffffffffff770);
          std::__cxx11::string::~string(local_390);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            poVar6 = std::operator<<((ostream *)&std::cout,"json_load_err ");
            std::__cxx11::ostringstream::str();
            poVar6 = std::operator<<(poVar6,local_3b0);
            std::operator<<(poVar6,"\n");
            std::__cxx11::string::~string(local_3b0);
          }
        }
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)in_stack_fffffffffffff280);
      }
    }
  }
  std::__cxx11::ostringstream::~ostringstream(local_2f8);
  in_RDI->polar_grid = false;
  in_RDI->enable_grid = true;
  in_RDI->enable_axes = true;
  sVar4 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::count<char_const(&)[5]>
                    (&in_stack_fffffffffffff290->owned_value,(char (*) [5])in_stack_fffffffffffff288
                    );
  if (sVar4 != 0) {
    local_3b8 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          (in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::is_object(local_3b8);
    if (bVar1) {
      sVar4 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[5]>
                        (&in_stack_fffffffffffff290->owned_value,
                         (char (*) [5])in_stack_fffffffffffff288);
      if (sVar4 != 0) {
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
        dVar12 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::get<double,_double,_0>
                           ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)in_stack_fffffffffffff280);
        (in_RDI->view).xmin = dVar12;
      }
      sVar4 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[5]>
                        (&in_stack_fffffffffffff290->owned_value,
                         (char (*) [5])in_stack_fffffffffffff288);
      if (sVar4 != 0) {
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
        dVar12 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::get<double,_double,_0>
                           ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)in_stack_fffffffffffff280);
        (in_RDI->view).xmax = dVar12;
      }
      sVar4 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[5]>
                        (&in_stack_fffffffffffff290->owned_value,
                         (char (*) [5])in_stack_fffffffffffff288);
      if (sVar4 != 0) {
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
        dVar12 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::get<double,_double,_0>
                           ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)in_stack_fffffffffffff280);
        (in_RDI->view).ymin = dVar12;
      }
      sVar4 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[5]>
                        (&in_stack_fffffffffffff290->owned_value,
                         (char (*) [5])in_stack_fffffffffffff288);
      if (sVar4 != 0) {
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
        dVar12 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::get<double,_double,_0>
                           ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)in_stack_fffffffffffff280);
        (in_RDI->view).ymax = dVar12;
      }
      local_3bc = (in_RDI->view).swid;
      local_3c0 = (in_RDI->view).shigh;
      sVar4 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[6]>
                        (&in_stack_fffffffffffff290->owned_value,
                         (char (*) [6])in_stack_fffffffffffff288);
      if (sVar4 != 0) {
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
        dVar12 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::get<double,_double,_0>
                           ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)in_stack_fffffffffffff280);
        (in_RDI->view).swid = (int)dVar12;
      }
      sVar4 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[7]>
                        (&in_stack_fffffffffffff290->owned_value,
                         (char (*) [7])in_stack_fffffffffffff288);
      if (sVar4 != 0) {
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
        dVar12 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::get<double,_double,_0>
                           ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)in_stack_fffffffffffff280);
        (in_RDI->view).shigh = (int)dVar12;
      }
      resize(in_RDI,local_3bc,local_3c0);
      sVar4 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[5]>
                        (&in_stack_fffffffffffff290->owned_value,
                         (char (*) [5])in_stack_fffffffffffff288);
      if (sVar4 != 0) {
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
        bVar1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get<bool,_bool,_0>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)in_stack_fffffffffffff280);
        in_RDI->enable_axes = bVar1;
      }
      sVar4 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[5]>
                        (&in_stack_fffffffffffff290->owned_value,
                         (char (*) [5])in_stack_fffffffffffff288);
      if (sVar4 != 0) {
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
        bVar1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get<bool,_bool,_0>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)in_stack_fffffffffffff280);
        in_RDI->enable_grid = bVar1;
      }
      sVar4 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[6]>
                        (&in_stack_fffffffffffff290->owned_value,
                         (char (*) [6])in_stack_fffffffffffff288);
      if (sVar4 != 0) {
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
        bVar1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get<bool,_bool,_0>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)in_stack_fffffffffffff280);
        in_RDI->polar_grid = bVar1;
      }
    }
  }
  std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::clear
            ((vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_> *)0x147746);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x14775a);
  sVar4 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::count<char_const(&)[8]>
                    (&in_stack_fffffffffffff290->owned_value,(char (*) [8])in_stack_fffffffffffff288
                    );
  if (sVar4 != 0) {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::is_array(pvVar5);
    if (bVar1) {
      in_stack_fffffffffffff490 =
           (Plotter *)
           nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
      local_3c8 = in_stack_fffffffffffff490;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)in_stack_fffffffffffff288);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)in_stack_fffffffffffff288);
      while (in_stack_fffffffffffff48f =
                  nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)in_stack_fffffffffffff280,
                               (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)in_stack_fffffffffffff278), (bool)in_stack_fffffffffffff48f) {
        local_420 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)in_stack_fffffffffffff2f8);
        bVar1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::is_object(local_420);
        if (bVar1) {
          local_428 = std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::size
                                (&in_RDI->sliders);
          std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::emplace_back<>
                    ((vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_> *)
                     in_stack_fffffffffffff280);
          sVar4 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[4]>
                            (&in_stack_fffffffffffff290->owned_value,
                             (char (*) [4])in_stack_fffffffffffff288);
          if (sVar4 != 0) {
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
            dVar12 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::get<double,_double,_0>
                               ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)in_stack_fffffffffffff280);
            pvVar7 = std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::
                     operator[](&in_RDI->sliders,local_428);
            pvVar7->lo = (float)dVar12;
          }
          sVar4 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[4]>
                            (&in_stack_fffffffffffff290->owned_value,
                             (char (*) [4])in_stack_fffffffffffff288);
          if (sVar4 != 0) {
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
            dVar12 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::get<double,_double,_0>
                               ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)in_stack_fffffffffffff280);
            pvVar7 = std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::
                     operator[](&in_RDI->sliders,local_428);
            pvVar7->hi = (float)dVar12;
          }
          sVar4 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[4]>
                            (&in_stack_fffffffffffff290->owned_value,
                             (char (*) [4])in_stack_fffffffffffff288);
          if (sVar4 != 0) {
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
            dVar12 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::get<double,_double,_0>
                               ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)in_stack_fffffffffffff280);
            pvVar7 = std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::
                     operator[](&in_RDI->sliders,local_428);
            pvVar7->val = (float)dVar12;
          }
          sVar4 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[4]>
                            (&in_stack_fffffffffffff290->owned_value,
                             (char (*) [4])in_stack_fffffffffffff288);
          if (sVar4 != 0) {
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (in_stack_fffffffffffff2a8);
            pvVar7 = std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::
                     operator[](&in_RDI->sliders,local_428);
            std::__cxx11::string::operator=((string *)pvVar7,local_448);
            std::__cxx11::string::~string(local_448);
            update_slider_var(in_stack_fffffffffffff320,(size_t)in_stack_fffffffffffff318);
            sVar4 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::count<char_const(&)[4]>
                              (&in_stack_fffffffffffff290->owned_value,
                               (char (*) [4])in_stack_fffffffffffff288);
            if (sVar4 == 0) {
              std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::operator[]
                        (&in_RDI->sliders,local_428);
              dVar12 = Environment::get(in_stack_fffffffffffff288,
                                        (string *)in_stack_fffffffffffff280);
              pvVar7 = std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::
                       operator[](&in_RDI->sliders,local_428);
              pvVar7->val = (float)dVar12;
            }
          }
        }
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)in_stack_fffffffffffff280);
      }
    }
  }
  sVar4 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::count<char_const(&)[6]>
                    (&in_stack_fffffffffffff290->owned_value,(char (*) [6])in_stack_fffffffffffff288
                    );
  if (sVar4 != 0) {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::is_array(pvVar5);
    if (bVar1) {
      local_450 = 0;
      local_458 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            (in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)in_stack_fffffffffffff288);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)in_stack_fffffffffffff288);
      while (bVar1 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)in_stack_fffffffffffff280,
                                  (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)in_stack_fffffffffffff278), bVar1) {
        local_4b0 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)in_stack_fffffffffffff2f8);
        std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::emplace_back<>
                  ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                   in_stack_fffffffffffff280);
        local_4b8 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                              (&in_RDI->funcs,local_450);
        bVar1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::is_object(local_4b0);
        if (bVar1) {
          sVar4 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[5]>
                            (&in_stack_fffffffffffff290->owned_value,
                             (char (*) [5])in_stack_fffffffffffff288);
          if (sVar4 != 0) {
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (in_stack_fffffffffffff2a8);
            std::__cxx11::string::operator=((string *)&local_4b8->expr_str,local_4d8);
            std::__cxx11::string::~string(local_4d8);
          }
          sVar4 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[6]>
                            (&in_stack_fffffffffffff290->owned_value,
                             (char (*) [6])in_stack_fffffffffffff288);
          if (sVar4 == 0) {
            color::from_int(in_stack_fffffffffffff298);
            color::color::operator=
                      ((color *)in_stack_fffffffffffff288,(color *)in_stack_fffffffffffff280);
            in_RDI->last_expr_color = local_450 + 1;
          }
          else {
            pvVar5 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               (in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
            bVar1 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::is_string(pvVar5);
            if (bVar1) {
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (in_stack_fffffffffffff2a8);
              color::from_hex(in_stack_fffffffffffff2b8);
              color::color::operator=
                        ((color *)in_stack_fffffffffffff288,(color *)in_stack_fffffffffffff280);
              std::__cxx11::string::~string(local_530);
            }
            else {
              bVar1 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::is_number_integer(pvVar5);
              if (bVar1) {
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get<int,_int,_0>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)in_stack_fffffffffffff280);
                color::from_int(in_stack_fffffffffffff298);
                color::color::operator=
                          ((color *)in_stack_fffffffffffff288,(color *)in_stack_fffffffffffff280);
              }
            }
          }
          sVar4 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[3]>
                            (&in_stack_fffffffffffff290->owned_value,
                             (char (*) [3])in_stack_fffffffffffff288);
          if (sVar4 == 0) {
            in_RDI->next_func_name = in_RDI->next_func_name + 1;
            std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff2b8);
            std::operator+((char *)in_stack_fffffffffffff288,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff280);
            std::__cxx11::string::operator=((string *)local_4b8,local_690);
            std::__cxx11::string::~string(local_690);
            std::__cxx11::string::~string(local_6b0);
          }
          else {
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
            local_624 = nlohmann::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::get<int,_int,_0>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                            *)in_stack_fffffffffffff280);
            local_630 = (long)local_624 + 1;
            puVar8 = std::max<unsigned_long>(&in_RDI->next_func_name,&local_630);
            in_RDI->next_func_name = *puVar8;
            std::__cxx11::to_string(in_stack_fffffffffffff2cc);
            std::operator+((char *)in_stack_fffffffffffff288,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff280);
            std::__cxx11::string::operator=((string *)local_4b8,local_650);
            std::__cxx11::string::~string(local_650);
            std::__cxx11::string::~string(local_670);
          }
          sVar4 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[5]>
                            (&in_stack_fffffffffffff290->owned_value,
                             (char (*) [5])in_stack_fffffffffffff288);
          if (sVar4 != 0) {
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
            dVar12 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::get<double,_double,_0>
                               ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)in_stack_fffffffffffff280);
            local_4b8->tmin = (float)dVar12;
          }
          sVar4 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[5]>
                            (&in_stack_fffffffffffff290->owned_value,
                             (char (*) [5])in_stack_fffffffffffff288);
          if (sVar4 != 0) {
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
            in_stack_fffffffffffff340 =
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::get<double,_double,_0>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)in_stack_fffffffffffff280);
            local_4b8->tmax = (float)(double)in_stack_fffffffffffff340;
          }
        }
        else {
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_string(local_4b0);
          if (bVar1) {
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (in_stack_fffffffffffff2a8);
            in_stack_fffffffffffff338 = local_6d0;
            std::__cxx11::string::operator=
                      ((string *)&local_4b8->expr_str,in_stack_fffffffffffff338);
            std::__cxx11::string::~string(in_stack_fffffffffffff338);
            in_RDI->next_func_name = in_RDI->next_func_name + 1;
            std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff2b8);
            std::operator+((char *)in_stack_fffffffffffff288,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff280);
            std::__cxx11::string::operator=((string *)local_4b8,local_6f0);
            std::__cxx11::string::~string(local_6f0);
            std::__cxx11::string::~string(local_710);
            color::from_int(in_stack_fffffffffffff298);
            color::color::operator=
                      ((color *)in_stack_fffffffffffff288,(color *)in_stack_fffffffffffff280);
            in_RDI->last_expr_color = local_450 + 1;
          }
        }
        local_450 = local_450 + 1;
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)in_stack_fffffffffffff280);
      }
      goto LAB_001485a5;
    }
  }
  std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::resize
            ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
             CONCAT17(in_stack_fffffffffffff2a7,in_stack_fffffffffffff2a0),in_stack_fffffffffffff298
            );
  pvVar9 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                     (&in_RDI->funcs,0);
  std::__cxx11::string::operator=((string *)&pvVar9->expr_str,"");
  pvVar9 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                     (&in_RDI->funcs,0);
  pvVar9->type = 0;
  in_RDI->last_expr_color = in_RDI->last_expr_color + 1;
  color::from_int(in_stack_fffffffffffff298);
  std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[](&in_RDI->funcs,0);
  color::color::operator=((color *)in_stack_fffffffffffff288,(color *)in_stack_fffffffffffff280);
  in_RDI->next_func_name = in_RDI->next_func_name + 1;
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff2b8);
  std::operator+((char *)in_stack_fffffffffffff288,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff280);
  pvVar9 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                     (&in_RDI->funcs,0);
  std::__cxx11::string::operator=((string *)pvVar9,local_7f0);
  std::__cxx11::string::~string(local_7f0);
  std::__cxx11::string::~string(local_810);
LAB_001485a5:
  std::deque<nivalis::color::color,_std::allocator<nivalis::color::color>_>::clear
            ((deque<nivalis::color::color,_std::allocator<nivalis::color::color>_> *)
             CONCAT17(in_stack_fffffffffffff2a7,in_stack_fffffffffffff2a0));
  sVar4 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::count<char_const(&)[9]>
                    (&in_stack_fffffffffffff290->owned_value,(char (*) [9])in_stack_fffffffffffff288
                    );
  if (sVar4 != 0) {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::is_object(pvVar5);
    if (bVar1) {
      sVar4 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[10]>
                        (&in_stack_fffffffffffff290->owned_value,
                         (char (*) [10])in_stack_fffffffffffff288);
      if (sVar4 == 0) {
        set_curr_func(in_stack_fffffffffffff490,
                      CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488));
      }
      else {
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
        iVar2 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get<int,_int,_0>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)in_stack_fffffffffffff280);
        if ((iVar2 < 0) ||
           (sVar10 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                               (&in_RDI->funcs), sVar10 <= (ulong)(long)iVar2)) {
          set_curr_func(in_stack_fffffffffffff490,
                        CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488));
        }
        else {
          set_curr_func(in_stack_fffffffffffff490,
                        CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488));
        }
      }
      this_00 = (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::count<char_const(&)[11]>
                             (&in_stack_fffffffffffff290->owned_value,
                              (char (*) [11])in_stack_fffffffffffff288);
      if (this_00 !=
          (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *)0x0) {
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
        dVar12 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::get<double,_double,_0>
                           ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)in_stack_fffffffffffff280);
        in_RDI->last_expr_color =
             (long)dVar12 | (long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f;
      }
      sVar4 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[12]>
                        (&in_stack_fffffffffffff290->owned_value,
                         (char (*) [12])in_stack_fffffffffffff288);
      if (sVar4 != 0) {
        pvVar5 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           (in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
        bVar1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::is_array(pvVar5);
        if (bVar1) {
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_stack_fffffffffffff288);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)in_stack_fffffffffffff288);
          while (bVar1 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       *)in_stack_fffffffffffff280,
                                      (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       *)in_stack_fffffffffffff278), bVar1) {
            nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator*(this_00);
            hex = (string *)&in_RDI->reuse_colors;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (in_stack_fffffffffffff2a8);
            color::from_hex(hex);
            std::deque<nivalis::color::color,_std::allocator<nivalis::color::color>_>::push_back
                      ((deque<nivalis::color::color,_std::allocator<nivalis::color::color>_> *)
                       in_stack_fffffffffffff280,(value_type *)in_stack_fffffffffffff278);
            std::__cxx11::string::~string(local_8d0);
            nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)in_stack_fffffffffffff280);
          }
        }
      }
    }
  }
  local_8d1 = 0;
  sVar4 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::count<char_const(&)[6]>
                    (&in_stack_fffffffffffff290->owned_value,(char (*) [6])in_stack_fffffffffffff288
                    );
  if (sVar4 != 0) {
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::operator[]<char_const>(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
    local_8d1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get<bool,_bool,_0>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)in_stack_fffffffffffff280);
  }
  if ((local_8d1 & 1) != (in_RDI->use_latex & 1U)) {
    if ((in_RDI->use_latex & 1U) == 0) {
      local_908 = 0;
      while (uVar13 = local_908,
            sVar10 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                               (&in_RDI->funcs), uVar13 < sVar10) {
        std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                  (&in_RDI->funcs,local_908);
        latex_to_nivalis(in_stack_00000b08);
        pvVar9 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                           (&in_RDI->funcs,local_908);
        std::__cxx11::string::operator=((string *)&pvVar9->expr_str,local_928);
        std::__cxx11::string::~string(local_928);
        local_908 = local_908 + 1;
      }
    }
    else {
      local_8e0 = 0;
      while (uVar13 = local_8e0,
            sVar10 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                               (&in_RDI->funcs), uVar13 < sVar10) {
        std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                  (&in_RDI->funcs,local_8e0);
        nivalis_to_latex_safe(in_stack_fffffffffffffb18);
        pvVar9 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                           (&in_RDI->funcs,local_8e0);
        std::__cxx11::string::operator=((string *)&pvVar9->expr_str,local_900);
        std::__cxx11::string::~string(local_900);
        local_8e0 = local_8e0 + 1;
      }
    }
  }
  local_930 = 0;
  while (uVar13 = local_930,
        sVar10 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                           (&in_RDI->funcs), uVar13 < sVar10) {
    reparse_expr(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
    local_930 = local_930 + 1;
  }
  local_938 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)0x0;
  while (this_01 = local_938,
        pbVar11 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                               (&in_RDI->funcs), this_01 < pbVar11) {
    reparse_expr(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
    local_938 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&local_938->field_0x1;
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(this_01);
  return local_10;
}

Assistant:

std::istream& Plotter::import_json(std::istream& is, std::string* error_msg) {
    if (error_msg) {
        error_msg->clear();
    }
    try {
        funcs.clear();

        json j; is >> j;
        if (j.is_array()) {
            // Interpret as function list
            j = json {
                {"funcs",  j}
            };
        }

        {
            // Load environment
            env.clear();
            x_var = env.addr_of("x", false);
            y_var = env.addr_of("y", false);
            t_var = env.addr_of("t", false);
            r_var = env.addr_of("r", false);
            std::ostringstream ss;
            Shell tmpshell(env, ss);
            if (j.count("shell") && j["shell"].is_array()) {
                for (auto& line : j["shell"]) {
                    if (line.is_string()) {
                        if (!tmpshell.eval_line(line.get<std::string>())) {
                            std::cout << "json_load_err " << ss.str() << "\n";
                        }
                    }
                }
            }
        }

        // Load view
        // Defaults
        polar_grid = false;
        enable_axes = enable_grid = true;
        if (j.count("view")) {
            json& jview = j["view"];
            if (jview.is_object()) {
                if (jview.count("xmin")) view.xmin = jview["xmin"].get<double>();
                if (jview.count("xmax")) view.xmax = jview["xmax"].get<double>();
                if (jview.count("xmin")) view.ymin = jview["ymin"].get<double>();
                if (jview.count("xmax")) view.ymax = jview["ymax"].get<double>();
                int old_swid = view.swid, old_shigh = view.shigh;
                if (jview.count("width")) view.swid = jview["width"].get<double>();
                if (jview.count("height")) view.shigh = jview["height"].get<double>();
                // Will resize bounds to fit screen
                // else will become too distorted
                resize(old_swid, old_shigh);
                if (jview.count("axes")) enable_axes = jview["axes"].get<bool>();
                if (jview.count("grid")) enable_grid = jview["grid"].get<bool>();
                if (jview.count("polar")) polar_grid = jview["polar"].get<bool>();
            }
        }

        // Load sliders
        sliders.clear();
        sliders_vars.clear();

        if (j.count("sliders") && j["sliders"].is_array()) {
            for (auto& slider : j["sliders"]) {
                if (!slider.is_object()) continue;
                size_t idx = sliders.size();
                sliders.emplace_back();
                if (slider.count("min"))
                    sliders[idx].lo = slider["min"].get<double>();
                if (slider.count("max"))
                    sliders[idx].hi = slider["max"].get<double>();
                if (slider.count("val")) {
                    sliders[idx].val = slider["val"].get<double>();
                }
                if (slider.count("var")) {
                    sliders[idx].var_name = slider["var"].get<std::string>();
                    update_slider_var(idx);
                    if (!slider.count("val")) {
                        sliders[idx].val = env.get(sliders[idx].var_name);
                    }
                }
            }
        }
        if (j.count("funcs") && j["funcs"].is_array()) {
            size_t idx = 0;
            for (auto& jfunc : j["funcs"]) {
                funcs.emplace_back();
                auto& f = funcs[idx];
                if (jfunc.is_object()) {
                    // Object form
                    if (jfunc.count("expr"))
                        f.expr_str = jfunc["expr"].get<std::string>();
                    if (jfunc.count("color")) {
                        auto& jcol = jfunc["color"];
                        if (jcol.is_string()) {
                            f.line_color = color::from_hex(
                                    jcol.get<std::string>());
                        } else if (jcol.is_number_integer()) {
                            f.line_color = color::from_int(
                                    (size_t)jcol.get<int>());
                        }
                    } else {
                        f.line_color = color::from_int(idx);
                        last_expr_color = idx+1;
                    }
                    if (jfunc.count("id")) {
                        int id = jfunc["id"].get<int>();
                        next_func_name = std::max(next_func_name, (size_t)id+1);
                        f.name = "f" + std::to_string(id);
                    } else {
                        f.name = "f" + std::to_string(next_func_name++);
                    }
                    if (jfunc.count("tmin")) {
                        f.tmin = jfunc["tmin"].get<double>();
                    }
                    if (jfunc.count("tmax")) {
                        f.tmax = jfunc["tmax"].get<double>();
                    }
                } else if (jfunc.is_string()) {
                    // Only expression
                    f.expr_str = jfunc.get<std::string>();
                    f.name = "f" + std::to_string(next_func_name++);
                    f.line_color = color::from_int(idx);
                    last_expr_color = idx+1;
                }
                ++idx;
            }
        } else {
            // Ensure there is at lease 1 function left
            funcs.resize(1);
            funcs[0].expr_str = "";
            funcs[0].type = Function::FUNC_TYPE_EXPLICIT;
            funcs[0].line_color = color::from_int(last_expr_color++);
            funcs[0].name = "f" + std::to_string(next_func_name++);
        }

        reuse_colors.clear();
        if (j.count("internal")) {
            json& jint = j["internal"];
            if (jint.is_object()) {
                if (jint.count("curr_func")) {
                    int cf = jint["curr_func"].get<int>();
                    if (cf < 0 || cf >= funcs.size()) {
                        set_curr_func(0);
                    } else {
                        set_curr_func(cf);
                    }
                } else {
                    set_curr_func(0);
                }
                if (jint.count("next_color")) last_expr_color =
                    jint["next_color"].get<double>();
                if (jint.count("color_queue") &&
                        jint["color_queue"].is_array()) {
                    for (auto& jcol : jint["color_queue"]) {
                        reuse_colors.push_back(color::from_hex(
                                    jcol.get<std::string>()));
                    }
                }
            }
        }
        bool imp_use_latex = false;
        if (j.count("latex")) {
            imp_use_latex = j["latex"].get<bool>() == true;
        }
        // If one save uses Nivalis expression format and the other uses LaTeX, try to convert
        if (imp_use_latex != use_latex) {
            if (use_latex) {
                for (size_t i = 0; i < funcs.size(); ++i) {
                    funcs[i].expr_str = nivalis_to_latex_safe(funcs[i].expr_str);
                }
            } else {
                for (size_t i = 0; i < funcs.size(); ++i) {
                    funcs[i].expr_str = latex_to_nivalis(funcs[i].expr_str);
                }
            }
        }
        for (size_t i = 0; i < funcs.size(); ++i) {
            reparse_expr(i);
        }
        for (size_t i = 0; i < funcs.size(); ++i) {
            // Reparse again in case of reference to other functions
            reparse_expr(i);
        }
    } catch (const json::parse_error& e) {
        if (error_msg != nullptr) {
            *error_msg = e.what();
        }
    }
    return is;
}